

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffldrc(fitsfile *fptr,long record,int err_mode,int *status)

{
  long lVar1;
  int *in_RCX;
  int in_EDX;
  int *in_RSI;
  fitsfile *in_RDI;
  LONGLONG rstart;
  int nbuff;
  int ibuff;
  undefined4 in_stack_00000028;
  int *in_stack_ffffffffffffffb8;
  FITSfile *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd0;
  int iVar2;
  int iVar3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI->HDUposition != in_RDI->Fptr->curhdu) {
    ffmahd(fptr,record._4_4_,(int *)CONCAT44(err_mode,in_stack_00000028),status);
  }
  for (iVar2 = 0x27; -1 < iVar2; iVar2 = iVar2 + -1) {
    in_stack_ffffffffffffffd0 = in_RDI->Fptr->ageindex[iVar2];
    if (in_RSI == (int *)in_RDI->Fptr->bufrecnum[in_stack_ffffffffffffffd0]) goto LAB_001185bb;
  }
  lVar1 = (long)in_RSI * 0xb40;
  if ((in_EDX == 0) && (in_RDI->Fptr->logfilesize <= lVar1)) {
    *in_RCX = 0x6b;
    iVar2 = 0x6b;
  }
  else {
    iVar3 = ffwhbf(in_RDI,(int *)&stack0xffffffffffffffd0);
    if (iVar3 < 0) {
      *in_RCX = 0x67;
      iVar2 = 0x67;
    }
    else {
      if (in_RDI->Fptr->dirty[in_stack_ffffffffffffffd0] != 0) {
        ffbfwt((FITSfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (int)((ulong)in_RDI >> 0x20),in_RSI);
      }
      if (lVar1 < in_RDI->Fptr->filesize) {
        if (in_RDI->Fptr->io_pos != lVar1) {
          ffseek(in_stack_ffffffffffffffc0,(LONGLONG)in_stack_ffffffffffffffb8);
        }
        ffread((FITSfile *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),lVar1,in_stack_ffffffffffffffc0
               ,in_stack_ffffffffffffffb8);
        in_RDI->Fptr->io_pos = lVar1 + 0xb40;
      }
      else {
        if (in_RDI->Fptr->hdutype == 1) {
          memset(in_RDI->Fptr->iobuffer + in_stack_ffffffffffffffd0 * 0xb40,0x20,0xb40);
        }
        else {
          memset(in_RDI->Fptr->iobuffer + in_stack_ffffffffffffffd0 * 0xb40,0,0xb40);
        }
        if (lVar1 + 0xb40 < in_RDI->Fptr->logfilesize) {
          lVar1 = in_RDI->Fptr->logfilesize;
        }
        else {
          lVar1 = lVar1 + 0xb40;
        }
        in_RDI->Fptr->logfilesize = lVar1;
        in_RDI->Fptr->dirty[in_stack_ffffffffffffffd0] = 1;
      }
      in_RDI->Fptr->bufrecnum[in_stack_ffffffffffffffd0] = (long)in_RSI;
LAB_001185bb:
      in_RDI->Fptr->curbuf = in_stack_ffffffffffffffd0;
      if (iVar2 < 0) {
        for (iVar2 = 0;
            (iVar2 < 0x28 && (in_RDI->Fptr->ageindex[iVar2] != in_stack_ffffffffffffffd0));
            iVar2 = iVar2 + 1) {
        }
      }
      while (iVar3 = iVar2 + 1, iVar3 < 0x28) {
        in_RDI->Fptr->ageindex[iVar2] = in_RDI->Fptr->ageindex[iVar3];
        iVar2 = iVar3;
      }
      in_RDI->Fptr->ageindex[0x27] = in_stack_ffffffffffffffd0;
      iVar2 = *in_RCX;
    }
  }
  return iVar2;
}

Assistant:

int ffldrc(fitsfile *fptr,        /* I - FITS file pointer             */
           long record,           /* I - record number to be loaded    */
           int err_mode,          /* I - 1=ignore EOF, 0 = return EOF error */
           int *status)           /* IO - error status                 */
{
/*
  low-level routine to load a specified record from a file into
  a physical buffer, if it is not already loaded.  Reset all
  pointers to make this the new current record for that file.
  Update ages of all the physical buffers.
*/
    int ibuff, nbuff;
    LONGLONG rstart;

    /* check if record is already loaded in one of the buffers */
    /* search from youngest to oldest buffer for efficiency */

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    for (ibuff = NIOBUF - 1; ibuff >= 0; ibuff--)
    {
      nbuff = (fptr->Fptr)->ageindex[ibuff];
      if (record == (fptr->Fptr)->bufrecnum[nbuff]) {
         goto updatebuf;  /* use 'goto' for efficiency */
      }
    }

    /* record is not already loaded */
    rstart = (LONGLONG)record * IOBUFLEN;

    if ( !err_mode && (rstart >= (fptr->Fptr)->logfilesize) )  /* EOF? */
         return(*status = END_OF_FILE);

    if (ffwhbf(fptr, &nbuff) < 0)  /* which buffer should we reuse? */
       return(*status = TOO_MANY_FILES); 

    if ((fptr->Fptr)->dirty[nbuff])
       ffbfwt(fptr->Fptr, nbuff, status); /* write dirty buffer to disk */

    if (rstart >= (fptr->Fptr)->filesize)  /* EOF? */
    {
      /* initialize an empty buffer with the correct fill value */
      if ((fptr->Fptr)->hdutype == ASCII_TBL)
         memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), 32, IOBUFLEN); /* blank fill */
      else
         memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN),  0, IOBUFLEN);  /* zero fill */

      (fptr->Fptr)->logfilesize = maxvalue((fptr->Fptr)->logfilesize, 
              rstart + IOBUFLEN);

      (fptr->Fptr)->dirty[nbuff] = TRUE;  /* mark record as having been modified */
    }
    else  /* not EOF, so read record from disk */
    {
      if ((fptr->Fptr)->io_pos != rstart)
           ffseek(fptr->Fptr, rstart);

      ffread(fptr->Fptr, IOBUFLEN, (fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), status);
      (fptr->Fptr)->io_pos = rstart + IOBUFLEN;  /* set new IO position */
    }

    (fptr->Fptr)->bufrecnum[nbuff] = record;   /* record number contained in buffer */

updatebuf:

    (fptr->Fptr)->curbuf = nbuff; /* this is the current buffer for this file */

    if (ibuff < 0)
    { 
      /* find the current position of the buffer in the age index */
      for (ibuff = 0; ibuff < NIOBUF; ibuff++)
         if ((fptr->Fptr)->ageindex[ibuff] == nbuff)
            break;  
    }

    /* increment the age of all the buffers that were younger than it */
    for (ibuff++; ibuff < NIOBUF; ibuff++)
      (fptr->Fptr)->ageindex[ibuff - 1] = (fptr->Fptr)->ageindex[ibuff];

    (fptr->Fptr)->ageindex[NIOBUF - 1] = nbuff; /* this is now the youngest buffer */
    return(*status);
}